

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub2.c
# Opt level: O1

int Gia_Rsb2ManLevel(Gia_Rsb2Man_t *p)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  int iVar4;
  
  (p->vLevels).nSize = 0;
  iVar4 = p->nObjs;
  if ((p->vLevels).nCap < iVar4) {
    piVar2 = (p->vLevels).pArray;
    if (piVar2 == (int *)0x0) {
      piVar2 = (int *)malloc((long)iVar4 << 2);
    }
    else {
      piVar2 = (int *)realloc(piVar2,(long)iVar4 << 2);
    }
    (p->vLevels).pArray = piVar2;
    if (piVar2 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vLevels).nCap = iVar4;
  }
  piVar2 = (p->vLevels).pArray;
  iVar4 = p->iFirstPo;
  if (p->nPis + 1 < iVar4) {
    lVar3 = (long)p->nPis + 1;
    do {
      iVar4 = piVar2[lVar3 * 2 + 1] / 2;
      if (piVar2[lVar3 * 2 + 1] / 2 < piVar2[lVar3 * 2] / 2) {
        iVar4 = piVar2[lVar3 * 2] / 2;
      }
      piVar2[lVar3] = iVar4 + 1;
      lVar3 = lVar3 + 1;
      iVar4 = p->iFirstPo;
    } while (lVar3 < iVar4);
  }
  iVar1 = 0;
  if (iVar4 < p->nObjs) {
    lVar3 = (long)iVar4;
    iVar1 = 0;
    do {
      iVar4 = piVar2[lVar3 * 2] / 2;
      if (iVar1 <= iVar4) {
        iVar1 = iVar4;
      }
      piVar2[lVar3] = iVar4;
      lVar3 = lVar3 + 1;
    } while (lVar3 < p->nObjs);
  }
  return iVar1;
}

Assistant:

int Gia_Rsb2ManLevel( Gia_Rsb2Man_t * p )
{
    int i, * pLevs, Level = 0;
    Vec_IntClear( &p->vLevels );
    Vec_IntGrow( &p->vLevels, p->nObjs );
    pLevs = Vec_IntArray( &p->vLevels );
    for ( i = p->nPis + 1; i < p->iFirstPo; i++ )
        pLevs[i] = 1 + Abc_MaxInt( pLevs[2*i+0]/2, pLevs[2*i+1]/2 );
    for ( i = p->iFirstPo; i < p->nObjs; i++ )
        Level = Abc_MaxInt( Level, pLevs[i] = pLevs[2*i+0]/2 );
    return Level;
}